

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.cc
# Opt level: O3

void __thiscall
message_test_should_throw_when_missing_fields_in_repeating_group_Test::TestBody
          (message_test_should_throw_when_missing_fields_in_repeating_group_Test *this)

{
  void **__s;
  _Base_bitset<1UL> _Var1;
  undefined8 message;
  bool bVar2;
  MarketDataIncrementalRefresh refresh;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_750 [226];
  FieldGroup<_fc5f2565_> local_40;
  FieldGroup<_fc5f2565_> group;
  
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
  super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_false>.value.val_.
  _M_string_length = 0;
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
  super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_false>.value.val_.
  field_2._M_allocated_capacity = 0;
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
  super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_false>.value.val_.
  _M_dataplus._M_p = (pointer)0x0;
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
  super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_false>.value.val_.
  field_2._8_8_ = 1;
  __s = (void **)((long)&refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.
                         base.super_tuple_value<_6b6e430_>.value + 0x10);
  memset(__s,0,18000);
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
  super_tuple_value<_6b6e430_>.value.val_.super_SmallVectorImpl<_eefd2475_>.
  super_SmallVectorTemplateBase<_41fc2cc4_>.super_SmallVectorTemplateCommon<_33b4c5d3_>.
  super_SmallVectorBase.EndX =
       (void *)((long)&refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
                       super_tuple_value<_6b6e430_>.value + 0x4660);
  _Var1._M_w = (long)&refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.unparsed.
                      super_SmallVectorImpl<_7a40c46_>.super_SmallVectorTemplateBase<_21811529_>.
                      super_SmallVectorTemplateCommon<_4b6ebcce_> + 0x10;
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.requiredBits.
  super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.unparsed.
  super_SmallVectorImpl<_7a40c46_>.super_SmallVectorTemplateBase<_21811529_>.
  super_SmallVectorTemplateCommon<_4b6ebcce_>.super_SmallVectorBase.EndX =
       (void *)((long)(refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.unparsed.
                       Storage.InlineElts + 8) + 0x10);
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
  super_tuple_value<_6b6e430_>.value.val_.Storage.InlineElts[8].super_AlignedCharArray<8UL,_1800UL>.
  buffer[0x700] = '\x01';
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
  super_tuple_value<_6b6e430_>.value.val_.Storage.InlineElts[8].super_AlignedCharArray<8UL,_1800UL>.
  buffer[0x701] = '\0';
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
  super_tuple_value<_6b6e430_>.value.val_.Storage.InlineElts[8].super_AlignedCharArray<8UL,_1800UL>.
  buffer[0x702] = '\0';
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
  super_tuple_value<_6b6e430_>.value.val_.Storage.InlineElts[8].super_AlignedCharArray<8UL,_1800UL>.
  buffer[0x703] = '\0';
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
  super_tuple_value<_6b6e430_>.value.val_.Storage.InlineElts[8].super_AlignedCharArray<8UL,_1800UL>.
  buffer[0x704] = '\0';
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
  super_tuple_value<_6b6e430_>.value.val_.Storage.InlineElts[8].super_AlignedCharArray<8UL,_1800UL>.
  buffer[0x705] = '\0';
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
  super_tuple_value<_6b6e430_>.value.val_.Storage.InlineElts[8].super_AlignedCharArray<8UL,_1800UL>.
  buffer[0x706] = '\0';
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
  super_tuple_value<_6b6e430_>.value.val_.Storage.InlineElts[8].super_AlignedCharArray<8UL,_1800UL>.
  buffer[0x707] = '\0';
  message = (long)(refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.unparsed.Storage
                   .InlineElts + 8) + 0x10;
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
  super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_false>.value._32_8_
       = __s;
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
  super_tuple_value<_6b6e430_>.value.val_.super_SmallVectorImpl<_eefd2475_>.
  super_SmallVectorTemplateBase<_41fc2cc4_>.super_SmallVectorTemplateCommon<_33b4c5d3_>.
  super_SmallVectorBase.BeginX = __s;
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.allBits.super__Base_bitset<1UL>.
  _M_w = _Var1;
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.unparsed.
  super_SmallVectorImpl<_7a40c46_>.super_SmallVectorTemplateBase<_21811529_>.
  super_SmallVectorTemplateCommon<_4b6ebcce_>.super_SmallVectorBase.BeginX = (void *)_Var1;
  local_40.field =
       (FieldType *)
       ((long)&refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
               super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_false>.
               value + 0x20);
  memset((void *)message,0,0x5f0);
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.unparsed.Storage.InlineElts[8].
  super_AlignedCharArray<8UL,_24UL>.buffer[0x11] = '\x01';
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.unparsed.Storage.InlineElts[8].
  super_AlignedCharArray<8UL,_24UL>.buffer[0x13] = '\x01';
  refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.unparsed.Storage.InlineElts[8].
  super_AlignedCharArray<8UL,_24UL>.buffer[0x15] = '\x01';
  time((time_t *)0x0);
  time((time_t *)0x0);
  time((time_t *)0x0);
  Fixpp::set<_10817cd1_>((InstanceGroup<_7a79f124_> *)message,(char (*) [5])"TEST");
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    Fixpp::FieldGroup<$fc5f2565$>::checkRequiredFields<_e67b6bae_>
              (&local_40,
               (InstanceGroup<_7a79f124_> *)
               ((long)(refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.unparsed.
                       Storage.InlineElts + 8) + 0x10));
    llvm::SmallVectorTemplateBase<$41fc2cc4$>::push_back
              ((SmallVectorTemplateBase<_41fc2cc4_> *)local_40.field,
               (InstanceGroup<_7a79f124_> *)
               ((long)(refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.unparsed.
                       Storage.InlineElts + 8) + 0x10));
  }
  testing::Message::Message((Message *)local_750);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&group,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
             ,0x5b,
             "Expected: group.add(instance) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&group,(Message *)local_750);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&group);
  if (((local_750[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_750[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_750[0].ptr_ + 8))();
  }
  meta::impl::tuple_base<$7b01f7b$>::~tuple_base
            ((tuple_base<_7b01f7b_> *)
             ((long)(refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.unparsed.
                     Storage.InlineElts + 8) + 0x10));
  if (refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.allBits.
      super__Base_bitset<1UL>._M_w != (_Base_bitset<1UL>)_Var1._M_w) {
    free((void *)refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.allBits.
                 super__Base_bitset<1UL>._M_w);
  }
  llvm::SmallVectorImpl<$eefd2475$>::~SmallVectorImpl
            ((SmallVectorImpl<_eefd2475_> *)
             ((long)&refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.values.base.
                     super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_false>
                     .value + 0x20));
  return;
}

Assistant:

TEST(message_test, should_throw_when_missing_fields_in_repeating_group)
{
    using namespace Fixpp;

    Fixpp::v42::Message::MarketDataIncrementalRefresh refresh;
    auto group = Fixpp::createGroup<Tag::NoMDEntries>(refresh, 1);
    auto instance = group.instance();

    Fixpp::set<Tag::MDEntryID>(instance, "TEST");
    ASSERT_THROW(group.add(instance), std::runtime_error);

    auto instance2 = group.instance();
    Fixpp::set<Tag::MDUpdateAction>(instance2, '0');
    ASSERT_NO_THROW(group.add(instance2));
}